

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

void uv__work_done(uv_async_t *handle)

{
  long *plVar1;
  long *plVar2;
  uv_handle_t *puVar3;
  undefined8 uVar4;
  long *local_28;
  uv_handle_t *local_20;
  
  uv_mutex_lock((uv_mutex_t *)&handle[-1].flags);
  plVar1 = (long *)((long)&handle[-1].u + 0x18);
  plVar2 = (long *)handle[-1].u.reserved[3];
  local_28 = (long *)&local_28;
  if (plVar1 != plVar2) {
    local_20 = handle[-1].next_closing;
    local_20->data = &local_28;
    puVar3 = (uv_handle_t *)plVar2[1];
    handle[-1].next_closing = puVar3;
    puVar3->data = plVar1;
    local_28 = plVar2;
  }
  local_28[1] = (long)&local_28;
  uv_mutex_unlock((uv_mutex_t *)&handle[-1].flags);
  if (&local_28 != (long **)local_28) {
    do {
      *(long *)local_28[1] = *local_28;
      *(long *)(*local_28 + 8) = local_28[1];
      uVar4 = 0;
      if ((code *)local_28[-3] == uv__cancelled) {
        uVar4 = 0xffffff83;
      }
      (*(code *)local_28[-2])(local_28 + -3,uVar4);
    } while (&local_28 != (long **)local_28);
  }
  return;
}

Assistant:

void uv__work_done(uv_async_t* handle) {
  struct uv__work* w;
  uv_loop_t* loop;
  QUEUE* q;
  QUEUE wq;
  int err;

  loop = container_of(handle, uv_loop_t, wq_async);
  uv_mutex_lock(&loop->wq_mutex);
  QUEUE_MOVE(&loop->wq, &wq);
  uv_mutex_unlock(&loop->wq_mutex);

  while (!QUEUE_EMPTY(&wq)) {
    q = QUEUE_HEAD(&wq);
    QUEUE_REMOVE(q);

    w = container_of(q, struct uv__work, wq);
    err = (w->work == uv__cancelled) ? UV_ECANCELED : 0;
    w->done(w, err);
  }
}